

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QByteArray>::appendIteratorRange<char_const(*)[14]>
          (QCommonArrayOps<QByteArray> *this,char (*b) [14],char (*e) [14],
          IfIsForwardIterator<const_char_(*)[14]> param_4)

{
  QByteArray *this_00;
  undefined1 in_CL;
  char (*in_RDX) [14];
  char (*in_RSI) [14];
  long in_RDI;
  QByteArray *iter;
  qsizetype distance;
  QArrayDataPointer<QByteArray> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe0;
  char (*local_10) [14];
  
  std::distance<char_const(*)[14]>
            (in_RDX,(char (*) [14])(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff));
  this_00 = QArrayDataPointer<QByteArray>::end(in_stack_ffffffffffffffd0);
  for (local_10 = in_RSI; local_10 != in_RDX; local_10 = local_10 + 1) {
    QByteArray::QByteArray(this_00,*local_10,-1);
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }